

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O0

bool google::protobuf::internal::WireFormatLite::SkipField
               (CodedInputStream *input,uint32 tag,CodedOutputStream *output)

{
  CodedInputStream *this;
  bool bVar1;
  int iVar2;
  WireType WVar3;
  uint32 expected;
  uint32 local_74 [2];
  uint32 value_2;
  undefined1 local_60 [8];
  string temp;
  uint64 uStack_38;
  uint32 length;
  uint64 value_1;
  uint64 value;
  CodedOutputStream *output_local;
  CodedInputStream *pCStack_18;
  uint32 tag_local;
  CodedInputStream *input_local;
  
  value = (uint64)output;
  output_local._4_4_ = tag;
  pCStack_18 = input;
  iVar2 = GetTagFieldNumber(tag);
  if (iVar2 == 0) {
    input_local._7_1_ = 0;
  }
  else {
    WVar3 = GetTagWireType(output_local._4_4_);
    switch(WVar3) {
    case WIRETYPE_VARINT:
      bVar1 = io::CodedInputStream::ReadVarint64(pCStack_18,&value_1);
      if (bVar1) {
        io::CodedOutputStream::WriteVarint32((CodedOutputStream *)value,output_local._4_4_);
        io::CodedOutputStream::WriteVarint64((CodedOutputStream *)value,value_1);
        input_local._7_1_ = 1;
      }
      else {
        input_local._7_1_ = 0;
      }
      break;
    case WIRETYPE_FIXED64:
      bVar1 = io::CodedInputStream::ReadLittleEndian64(pCStack_18,&stack0xffffffffffffffc8);
      if (bVar1) {
        io::CodedOutputStream::WriteVarint32((CodedOutputStream *)value,output_local._4_4_);
        io::CodedOutputStream::WriteLittleEndian64((CodedOutputStream *)value,uStack_38);
        input_local._7_1_ = 1;
      }
      else {
        input_local._7_1_ = 0;
      }
      break;
    case WIRETYPE_LENGTH_DELIMITED:
      bVar1 = io::CodedInputStream::ReadVarint32
                        (pCStack_18,(uint32 *)(temp.field_2._M_local_buf + 0xc));
      if (bVar1) {
        io::CodedOutputStream::WriteVarint32((CodedOutputStream *)value,output_local._4_4_);
        io::CodedOutputStream::WriteVarint32((CodedOutputStream *)value,temp.field_2._12_4_);
        std::__cxx11::string::string((string *)local_60);
        input_local._7_1_ =
             io::CodedInputStream::ReadString(pCStack_18,(string *)local_60,temp.field_2._12_4_);
        if ((bool)input_local._7_1_) {
          io::CodedOutputStream::WriteString((CodedOutputStream *)value,(string *)local_60);
        }
        local_74[1] = 1;
        std::__cxx11::string::~string((string *)local_60);
      }
      else {
        input_local._7_1_ = 0;
      }
      break;
    case WIRETYPE_START_GROUP:
      io::CodedOutputStream::WriteVarint32((CodedOutputStream *)value,output_local._4_4_);
      bVar1 = io::CodedInputStream::IncrementRecursionDepth(pCStack_18);
      if (bVar1) {
        bVar1 = SkipMessage(pCStack_18,(CodedOutputStream *)value);
        if (bVar1) {
          io::CodedInputStream::DecrementRecursionDepth(pCStack_18);
          this = pCStack_18;
          iVar2 = GetTagFieldNumber(output_local._4_4_);
          expected = MakeTag(iVar2,WIRETYPE_END_GROUP);
          bVar1 = io::CodedInputStream::LastTagWas(this,expected);
          if (bVar1) {
            input_local._7_1_ = 1;
          }
          else {
            input_local._7_1_ = 0;
          }
        }
        else {
          input_local._7_1_ = 0;
        }
      }
      else {
        input_local._7_1_ = 0;
      }
      break;
    case WIRETYPE_END_GROUP:
      input_local._7_1_ = 0;
      break;
    case WIRETYPE_FIXED32:
      bVar1 = io::CodedInputStream::ReadLittleEndian32(pCStack_18,local_74);
      if (bVar1) {
        io::CodedOutputStream::WriteVarint32((CodedOutputStream *)value,output_local._4_4_);
        io::CodedOutputStream::WriteLittleEndian32((CodedOutputStream *)value,local_74[0]);
        input_local._7_1_ = 1;
      }
      else {
        input_local._7_1_ = 0;
      }
      break;
    default:
      input_local._7_1_ = 0;
    }
  }
  return (bool)(input_local._7_1_ & 1);
}

Assistant:

bool WireFormatLite::SkipField(
    io::CodedInputStream* input, uint32 tag, io::CodedOutputStream* output) {
  // Field number 0 is illegal.
  if (WireFormatLite::GetTagFieldNumber(tag) == 0) return false;
  switch (WireFormatLite::GetTagWireType(tag)) {
    case WireFormatLite::WIRETYPE_VARINT: {
      uint64 value;
      if (!input->ReadVarint64(&value)) return false;
      output->WriteVarint32(tag);
      output->WriteVarint64(value);
      return true;
    }
    case WireFormatLite::WIRETYPE_FIXED64: {
      uint64 value;
      if (!input->ReadLittleEndian64(&value)) return false;
      output->WriteVarint32(tag);
      output->WriteLittleEndian64(value);
      return true;
    }
    case WireFormatLite::WIRETYPE_LENGTH_DELIMITED: {
      uint32 length;
      if (!input->ReadVarint32(&length)) return false;
      output->WriteVarint32(tag);
      output->WriteVarint32(length);
      // TODO(mkilavuz): Provide API to prevent extra string copying.
      string temp;
      if (!input->ReadString(&temp, length)) return false;
      output->WriteString(temp);
      return true;
    }
    case WireFormatLite::WIRETYPE_START_GROUP: {
      output->WriteVarint32(tag);
      if (!input->IncrementRecursionDepth()) return false;
      if (!SkipMessage(input, output)) return false;
      input->DecrementRecursionDepth();
      // Check that the ending tag matched the starting tag.
      if (!input->LastTagWas(WireFormatLite::MakeTag(
          WireFormatLite::GetTagFieldNumber(tag),
          WireFormatLite::WIRETYPE_END_GROUP))) {
        return false;
      }
      return true;
    }
    case WireFormatLite::WIRETYPE_END_GROUP: {
      return false;
    }
    case WireFormatLite::WIRETYPE_FIXED32: {
      uint32 value;
      if (!input->ReadLittleEndian32(&value)) return false;
      output->WriteVarint32(tag);
      output->WriteLittleEndian32(value);
      return true;
    }
    default: {
      return false;
    }
  }
}